

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O1

void * __thiscall
Diligent::FixedBlockMemoryAllocator::MemoryPage::GetBlockStartAddress
          (MemoryPage *this,Uint32 BlockIndex)

{
  char (*in_RCX) [29];
  string msg;
  string local_38;
  
  if (this->m_pOwnerAllocator == (FixedBlockMemoryAllocator *)0x0) {
    FormatString<char[26],char[29]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pOwnerAllocator != nullptr",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetBlockStartAddress",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x54);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->m_pOwnerAllocator->m_NumBlocksInPage <= BlockIndex) {
    FormatString<char[20]>(&local_38,(char (*) [20])"Invalid block index");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetBlockStartAddress",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x55);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return (void *)((ulong)BlockIndex * this->m_pOwnerAllocator->m_BlockSize +
                 (long)this->m_pPageStart);
}

Assistant:

void* FixedBlockMemoryAllocator::MemoryPage::GetBlockStartAddress(Uint32 BlockIndex) const
{
    VERIFY_EXPR(m_pOwnerAllocator != nullptr);
    VERIFY(BlockIndex < m_pOwnerAllocator->m_NumBlocksInPage, "Invalid block index");
    return reinterpret_cast<Uint8*>(m_pPageStart) + BlockIndex * m_pOwnerAllocator->m_BlockSize;
}